

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.cpp
# Opt level: O0

void __thiscall OpenMD::BondStamp::validate(BondStamp *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_RDI;
  double data;
  DataHolder *in_stack_00000150;
  ParamConstraintFacade<OpenMD::PositiveConstraint> *in_stack_ffffffffffffff58;
  string local_58 [48];
  PositiveConstraint local_28;
  
  DataHolder::validate(in_stack_00000150);
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    isPositive();
    data = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x68));
    bVar1 = PositiveConstraint::operator()(&local_28,data);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x3184ca);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      uVar2 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                (in_stack_ffffffffffffff58);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_58);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x318552);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void BondStamp::validate() {
    DataHolder::validate();
    CheckParameter(BondOrder, isPositive());
  }